

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShow.c
# Opt level: O0

int Gia_ShowAddOut(Vec_Int_t *vAdds,Vec_Int_t *vMapAdds,int Node)

{
  int iVar1;
  int iBox;
  int Node_local;
  Vec_Int_t *vMapAdds_local;
  Vec_Int_t *vAdds_local;
  
  iVar1 = Vec_IntEntry(vMapAdds,Node);
  vAdds_local._4_4_ = Node;
  if (-1 < iVar1) {
    vAdds_local._4_4_ = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
  }
  return vAdds_local._4_4_;
}

Assistant:

int Gia_ShowAddOut( Vec_Int_t * vAdds, Vec_Int_t * vMapAdds, int Node )
{
    int iBox = Vec_IntEntry( vMapAdds, Node );
    if ( iBox >= 0 )
        return Vec_IntEntry( vAdds, 6*iBox+4 );
    return Node;
}